

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

Function * __thiscall
jsonnet::internal::Allocator::clone<jsonnet::internal::Function>(Allocator *this,Function *ast)

{
  Function *this_00;
  Function *r;
  Function *in_stack_ffffffffffffffd8;
  Function *in_stack_ffffffffffffffe0;
  
  this_00 = (Function *)operator_new(0xd8);
  Function::Function(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  std::__cxx11::list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>::push_back
            ((list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_> *)this_00,
             (value_type *)this_00);
  return this_00;
}

Assistant:

T *clone(T *ast)
    {
        auto r = new T(*ast);
        allocated.push_back(r);
        return r;
    }